

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O0

double raw_motion_error_stdev(int *raw_motion_err_list,int raw_motion_err_counts)

{
  int in_ESI;
  long in_RDI;
  int i;
  double raw_err_stdev;
  double raw_err_avg;
  int64_t sum_raw_err;
  undefined4 local_34;
  undefined8 local_30;
  undefined8 local_20;
  undefined8 local_8;
  
  local_20 = 0;
  local_30 = 0.0;
  if (in_ESI == 0) {
    local_8 = 0.0;
  }
  else {
    for (local_34 = 0; local_34 < in_ESI; local_34 = local_34 + 1) {
      local_20 = *(int *)(in_RDI + (long)local_34 * 4) + local_20;
    }
    for (local_34 = 0; local_34 < in_ESI; local_34 = local_34 + 1) {
      local_30 = ((double)*(int *)(in_RDI + (long)local_34 * 4) - (double)local_20 / (double)in_ESI)
                 * ((double)*(int *)(in_RDI + (long)local_34 * 4) -
                   (double)local_20 / (double)in_ESI) + local_30;
    }
    local_8 = sqrt(local_30 / (double)in_ESI);
  }
  return local_8;
}

Assistant:

static double raw_motion_error_stdev(int *raw_motion_err_list,
                                     int raw_motion_err_counts) {
  int64_t sum_raw_err = 0;
  double raw_err_avg = 0;
  double raw_err_stdev = 0;
  if (raw_motion_err_counts == 0) return 0;

  int i;
  for (i = 0; i < raw_motion_err_counts; i++) {
    sum_raw_err += raw_motion_err_list[i];
  }
  raw_err_avg = (double)sum_raw_err / raw_motion_err_counts;
  for (i = 0; i < raw_motion_err_counts; i++) {
    raw_err_stdev += (raw_motion_err_list[i] - raw_err_avg) *
                     (raw_motion_err_list[i] - raw_err_avg);
  }
  // Calculate the standard deviation for the motion error of all the inter
  // blocks of the 0,0 motion using the last source
  // frame as the reference.
  raw_err_stdev = sqrt(raw_err_stdev / raw_motion_err_counts);
  return raw_err_stdev;
}